

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int vm_builtin_print(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_vm *pjVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  int nDataLen;
  uint local_2c;
  
  local_2c = 0;
  if (0 < nArg) {
    pjVar1 = pCtx->pVm;
    uVar4 = 0;
    do {
      pcVar3 = jx9_value_to_string(apArg[uVar4],(int *)&local_2c);
      if (0 < (int)local_2c) {
        iVar2 = (*(pjVar1->sVmConsumer).xConsumer)(pcVar3,local_2c,(pjVar1->sVmConsumer).pUserData);
        pjVar1->nOutputLen = pjVar1->nOutputLen + local_2c;
        if (iVar2 == -10) {
          return -10;
        }
      }
      uVar4 = uVar4 + 1;
    } while ((uint)nArg != uVar4);
  }
  return 0;
}

Assistant:

static int vm_builtin_print(jx9_context *pCtx, int nArg,jx9_value **apArg)
{
	const char *zData;
	int nDataLen = 0;
	jx9_vm *pVm;
	int i, rc;
	/* Point to the target VM */
	pVm = pCtx->pVm;
	/* Output */
	for( i = 0 ; i < nArg ; ++i ){
		zData = jx9_value_to_string(apArg[i], &nDataLen);
		if( nDataLen > 0 ){
			rc = pVm->sVmConsumer.xConsumer((const void *)zData, (unsigned int)nDataLen, pVm->sVmConsumer.pUserData);
			/* Increment output length */
			pVm->nOutputLen += nDataLen;
			if( rc == SXERR_ABORT ){
				/* Output consumer callback request an operation abort */
				return JX9_ABORT;
			}
		}
	}
	return SXRET_OK;
}